

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIODestroyFmsIODataCollectionInfo(FmsIODataCollectionInfo *dc_info)

{
  FmsIODomainNameInfo *__ptr;
  FmsInt FVar1;
  FmsIODomainInfo *__ptr_00;
  FmsIOComponentInfo *__ptr_01;
  FmsIOComponentPartInfo *__ptr_02;
  FmsIOTagInfo *__ptr_03;
  FmsIOFieldInfo *__ptr_04;
  FmsIOMetaDataInfo *minfo;
  int in_EAX;
  int extraout_EAX;
  FmsIOMeshInfo *pFVar2;
  FmsInt FVar3;
  FmsInt FVar4;
  long lVar5;
  long lVar6;
  FmsInt FVar7;
  FmsInt FVar8;
  bool bVar9;
  
  if (dc_info != (FmsIODataCollectionInfo *)0x0) {
    pFVar2 = dc_info->mesh_info;
    FVar4 = pFVar2->ndomain_names;
    if (FVar4 != 0) {
      for (FVar3 = 0; __ptr = dc_info->mesh_info->domain_names, FVar3 != FVar4; FVar3 = FVar3 + 1) {
        FVar1 = __ptr[FVar3].ndomains;
        for (FVar7 = 0; __ptr_00 = dc_info->mesh_info->domain_names[FVar3].domains, FVar7 != FVar1;
            FVar7 = FVar7 + 1) {
          FVar8 = __ptr_00[FVar7].dim;
          lVar5 = 0x20;
          while( true ) {
            bVar9 = FVar8 == 0;
            FVar8 = FVar8 - 1;
            if (bVar9) break;
            free(*(void **)((long)&(__ptr_00[FVar7].entities)->ent_type + lVar5));
            lVar5 = lVar5 + 0x28;
          }
          free(__ptr_00[FVar7].entities);
        }
        free(__ptr_00);
      }
      free(__ptr);
      pFVar2 = dc_info->mesh_info;
    }
    FVar4 = pFVar2->ncomponents;
    if (FVar4 != 0) {
      for (FVar3 = 0; __ptr_01 = dc_info->mesh_info->components, FVar3 != FVar4; FVar3 = FVar3 + 1)
      {
        FVar1 = __ptr_01[FVar3].nparts;
        lVar5 = 0;
        for (FVar7 = 0; __ptr_02 = __ptr_01[FVar3].parts, FVar7 != FVar1; FVar7 = FVar7 + 1) {
          for (lVar6 = 0x40; lVar6 != 0x180; lVar6 = lVar6 + 0x28) {
            if (*(long *)((long)__ptr_02->entities + lVar6 + lVar5 + -0x38) != 0) {
              free(*(void **)((long)__ptr_02->entities + lVar6 + lVar5 + -0x20));
            }
          }
          lVar5 = lVar5 + 0x160;
        }
        free(__ptr_02);
        if (__ptr_01[FVar3].relation_size != 0) {
          free(__ptr_01[FVar3].relation_values);
        }
      }
      free(__ptr_01);
      pFVar2 = dc_info->mesh_info;
    }
    FVar4 = pFVar2->ntags;
    if (FVar4 != 0) {
      lVar5 = 0x38;
      while( true ) {
        __ptr_03 = dc_info->mesh_info->tags;
        bVar9 = FVar4 == 0;
        FVar4 = FVar4 - 1;
        if (bVar9) break;
        free(*(void **)((long)__ptr_03 + lVar5 + -0x20));
        free(*(void **)((long)__ptr_03 + lVar5 + -8));
        free(*(void **)((long)&__ptr_03->name + lVar5));
        lVar5 = lVar5 + 0x40;
      }
      free(__ptr_03);
      pFVar2 = dc_info->mesh_info;
    }
    free(pFVar2->partition_info);
    free(dc_info->mesh_info);
    FVar4 = dc_info->nfds;
    if (FVar4 != 0) {
      lVar5 = 0x18;
      while( true ) {
        bVar9 = FVar4 == 0;
        FVar4 = FVar4 - 1;
        if (bVar9) break;
        free(*(void **)((long)&dc_info->fds->name + lVar5));
        lVar5 = lVar5 + 0x28;
      }
      free(dc_info->fds);
    }
    FVar4 = dc_info->nfields;
    if (FVar4 != 0) {
      lVar5 = 0x38;
      while( true ) {
        __ptr_04 = dc_info->fields;
        bVar9 = FVar4 == 0;
        FVar4 = FVar4 - 1;
        if (bVar9) break;
        free(*(void **)((long)__ptr_04 + lVar5 + -8));
        minfo = *(FmsIOMetaDataInfo **)((long)&__ptr_04->name + lVar5);
        if (minfo != (FmsIOMetaDataInfo *)0x0) {
          FmsIODestroyFmsIOMetaDataInfo(minfo);
          free(*(void **)((long)&__ptr_04->name + lVar5));
        }
        lVar5 = lVar5 + 0x40;
      }
      free(__ptr_04);
    }
    if (dc_info->md != (FmsIOMetaDataInfo *)0x0) {
      FmsIODestroyFmsIOMetaDataInfo(dc_info->md);
      free(dc_info->md);
    }
    free(dc_info);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int
FmsIODestroyFmsIODataCollectionInfo(FmsIODataCollectionInfo *dc_info) {
  if(!dc_info) E_RETURN(1);

  // Destroy DomainNameInfos & DomainInfos
  const FmsInt ndomnames = dc_info->mesh_info->ndomain_names;
  if(ndomnames) {
    FmsInt i;
    for(i = 0; i < ndomnames; i++) {
      FmsInt j;
      FmsInt ndoms = dc_info->mesh_info->domain_names[i].ndomains;
      for(j = 0; j < ndoms; j++) {
        FmsInt k = 0;
        FmsIODomainInfo *dinfo = &dc_info->mesh_info->domain_names[i].domains[j];
        const FmsInt dim = dinfo->dim;
        for(k = 0; k < dim; k++) {
          FmsIOEntityInfo *einfo = &dinfo->entities[k];
          FREE(einfo->values);
          // FREE(einfo); // It's a 1-D array
        }
        FREE(dinfo->entities);
      }
      FREE(dc_info->mesh_info->domain_names[i].domains);
    }
    FREE(dc_info->mesh_info->domain_names);
  }

  // Destroy ComponentInfos
  const FmsInt ncomponents = dc_info->mesh_info->ncomponents;
  if(ncomponents) {
    FmsInt i;
    for(i = 0; i < ncomponents; i++) {
      FmsIOComponentInfo *comp_info = &dc_info->mesh_info->components[i];
      const FmsInt nparts = comp_info->nparts;
      FmsInt j;
      for(j = 0; j < nparts; j++) {
        FmsIOComponentPartInfo *pinfo = &comp_info->parts[j];
        FmsInt k;
        for(k = 0; k < FMS_NUM_ENTITY_TYPES; k++) {
          if(pinfo->entities[k].nents)
            FREE(pinfo->entities[k].values);
        }
      }
      FREE(comp_info->parts);
      // Add the component relations
      const FmsInt nrelations = comp_info->relation_size;
      if(nrelations) {
        FREE(comp_info->relation_values);
      }
    }
    FREE(dc_info->mesh_info->components);
  }

  // Destroy TagInfos
  const FmsInt ntags = dc_info->mesh_info->ntags;
  if(ntags) {
    FmsInt i;
    for(i = 0; i < ntags; i++) {
      FmsIOTagInfo *tinfo = &dc_info->mesh_info->tags[i];
      FREE(tinfo->values);
      FREE(tinfo->tag_values);
      FREE(tinfo->descriptions);
    }
    FREE(dc_info->mesh_info->tags);
  }

  FREE(dc_info->mesh_info->partition_info);
  FREE(dc_info->mesh_info);

  // Add FieldDescriptors
  const FmsInt nfds = dc_info->nfds;
  if(nfds) {
    FmsInt i;
    for(i = 0; i < nfds; i++) {
      FmsIOFieldDescriptorInfo *fd_info = &dc_info->fds[i];
      FREE(fd_info->fixed_order);
    }
    FREE(dc_info->fds);
  }

  const FmsInt nfields = dc_info->nfields;
  if(nfields) {
    FmsInt i;
    for(i = 0; i < nfields; i++) {
      FmsIOFieldInfo *finfo = &dc_info->fields[i];
      FREE(finfo->data);
      if(finfo->md) {
        FmsIODestroyFmsIOMetaDataInfo(finfo->md);
        FREE(finfo->md);
      }
    }
    FREE(dc_info->fields);
  }

  // If we have MetaData destroy it
  if(dc_info->md) {
    FmsIODestroyFmsIOMetaDataInfo(dc_info->md);
    FREE(dc_info->md);
  }

  FREE(dc_info);

  return 0;
}